

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  uint16_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  char cVar4;
  int i;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint64_t uVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  long lVar22;
  exr_const_context_t p_Var23;
  ulong uVar24;
  uint16_t *puVar25;
  ulong uVar26;
  byte *pbVar27;
  uint16_t *puVar28;
  byte *pbVar29;
  bool bVar30;
  double dVar31;
  long alStack_40998 [32816];
  byte local_814;
  int currBitCount;
  uint16_t *local_7f8;
  uint16_t *local_7f0;
  uint8_t *currByte;
  ulong local_7e0;
  uint64_t currBits;
  uint64_t local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  uint16_t *local_7b8;
  uint8_t *local_7b0;
  uint64_t offset [59];
  uint64_t base [59];
  size_t codeCount [59];
  uint64_t local_208 [59];
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    p_Var23 = (exr_const_context_t)0x0;
  }
  else {
    p_Var23 = decode->context;
  }
  if (nCompressed < 0x14) {
    return (uint)(nRaw != 0) * 3;
  }
  if (sparebytes != 0xc0008) {
    return 3;
  }
  uVar15 = *(uint *)compressed;
  puVar28 = (uint16_t *)(ulong)uVar15;
  uVar7 = *(uint *)(compressed + 4);
  if (0x10000 < uVar7 || (uint16_t *)0x10000 < puVar28) {
    return 0x17;
  }
  local_7c8 = (ulong)*(uint *)(compressed + 0xc);
  local_7c0 = local_7c8 + 7 >> 3;
  if (nCompressed < local_7c0 + 0x14) {
    return 1;
  }
  puVar25 = (uint16_t *)(ulong)uVar7;
  pbVar27 = compressed + 0x14;
  local_7f8 = puVar25;
  local_7f0 = raw;
  local_7d0 = nRaw;
  local_7b8 = puVar28;
  if (0x80 < *(uint *)(compressed + 0xc)) {
    *(uint *)spare = uVar7;
    *(undefined4 *)((long)spare + 4) = 0;
    *(undefined2 *)((long)spare + 8) = 0xff;
    for (lVar8 = 0; lVar8 != 0x3b; lVar8 = lVar8 + 1) {
      codeCount[lVar8] = 0;
      base[lVar8] = 0xffffffffffffffff;
      offset[lVar8] = 0;
    }
    currBits = 0;
    currBitCount = 0;
    local_814 = 0xff;
    local_7e0 = local_7e0 & 0xffffffff00000000;
    currByte = pbVar27;
    local_7b0 = compressed;
    while( true ) {
      uVar26 = (ulong)local_814;
      cVar4 = (char)local_7e0;
      uVar19 = local_7e0 & 0xff;
      if (local_7f8 < puVar28) break;
      if (pbVar27 + ((int)nCompressed + -0x14) <= currByte) {
LAB_0010c306:
        if (p_Var23 == (exr_const_context_t)0x0) {
          return 0x17;
        }
        pcVar20 = "Error decoding Huffman table (Truncated table data).";
        goto LAB_0010c4bc;
      }
      uVar9 = fasthuf_read_bits(6,&currBits,&currBitCount,&currByte);
      if (uVar9 < 0x3b) {
        if (uVar9 != 0) {
          bVar14 = (byte)uVar9;
          if (uVar9 < uVar26) {
            *(byte *)((long)spare + 8) = bVar14;
            local_814 = bVar14;
          }
          if (uVar19 < uVar9) {
            *(byte *)((long)spare + 9) = bVar14;
            local_7e0 = CONCAT44(local_7e0._4_4_,(int)uVar9);
          }
          codeCount[uVar9] = codeCount[uVar9] + 1;
          goto LAB_0010c2ce;
        }
      }
      else {
        if (uVar9 == 0x3f) {
          if (pbVar27 + ((int)nCompressed + -0x14) <= currByte) goto LAB_0010c306;
          uVar9 = fasthuf_read_bits(8,&currBits,&currBitCount,&currByte);
          puVar28 = (uint16_t *)((long)puVar28 + uVar9 + 5);
        }
        else {
          puVar28 = (uint16_t *)((long)puVar28 + (uVar9 - 0x3a));
        }
LAB_0010c2ce:
        if (local_7f8 < puVar28) {
          if (p_Var23 == (exr_const_context_t)0x0) {
            return 0x17;
          }
          pcVar20 = "Error decoding Huffman table (Run beyond end of table).";
          goto LAB_0010c4bc;
        }
      }
      puVar28 = (uint16_t *)((long)puVar28 + 1);
    }
    uVar15 = 0;
    for (lVar8 = 0; lVar8 != 0x3a; lVar8 = lVar8 + 1) {
      uVar15 = uVar15 + (int)codeCount[lVar8];
    }
    *(uint *)((long)spare + 4) = uVar15;
    if (0x10001 < uVar15) {
      if (p_Var23 == (exr_const_context_t)0x0) {
        return 0x17;
      }
      pcVar20 = "Error decoding Huffman table (Too many symbols).";
LAB_0010c4bc:
      (**(code **)(p_Var23 + 0x48))(p_Var23,0x17,pcVar20);
      return 0x17;
    }
    lVar8 = uVar19 - uVar26;
    for (uVar12 = uVar26; uVar24 = uVar26, uVar12 <= uVar19; uVar12 = uVar12 + 1) {
      offset[uVar12] =
           (uint64_t)
           ((double)(2L << ((byte)lVar8 & 0x3f)) *
           (((double)CONCAT44(0x45300000,(int)(codeCount[uVar12] >> 0x20)) - 1.9342813113834067e+25)
           + ((double)CONCAT44(0x43300000,(int)codeCount[uVar12]) - 4503599627370496.0)));
      lVar8 = lVar8 + -1;
    }
    while (puVar28 = local_7b8, uVar24 <= uVar19) {
      dVar31 = 0.0;
      for (uVar12 = uVar24 + 1; uVar12 <= uVar19; uVar12 = uVar12 + 1) {
        dVar31 = dVar31 + (double)offset[uVar12];
      }
      dVar31 = ceil(dVar31 / (double)(2L << (cVar4 - (char)uVar24 & 0x3fU)));
      base[uVar24] = (long)(dVar31 - 9.223372036854776e+18) & (long)dVar31 >> 0x3f | (long)dVar31;
      uVar24 = uVar24 + 1;
    }
    uVar9 = 0;
    for (uVar12 = uVar19; offset[uVar12] = uVar9, (long)uVar26 < (long)uVar12; uVar12 = uVar12 - 1)
    {
      uVar9 = uVar9 + codeCount[uVar12];
    }
    for (lVar8 = 0; uVar12 = uVar26, lVar8 != 0x3b; lVar8 = lVar8 + 1) {
      local_208[lVar8] = 0xffffffffffffffff;
    }
    for (; uVar12 <= uVar19; uVar12 = uVar12 + 1) {
      local_208[uVar12] = offset[uVar12];
    }
    currBits = 0;
    currBitCount = 0;
    currByte = pbVar27;
    for (; puVar3 = currByte, puVar28 <= local_7f8; puVar28 = (uint16_t *)((long)puVar28 + 1)) {
      uVar9 = fasthuf_read_bits(6,&currBits,&currBitCount,&currByte);
      if (uVar9 < 0x3b) {
        if (uVar9 != 0) {
          uVar12 = local_208[uVar9];
          if ((ulong)(long)*(int *)((long)spare + 4) <= uVar12) {
            if (p_Var23 != (exr_const_context_t)0x0) {
              (**(code **)(p_Var23 + 0x48))
                        (p_Var23,0x17,"Huffman decode error (Invalid symbol in header)");
            }
            return 0x17;
          }
          *(int *)((long)spare + uVar12 * 4 + 0xc) = (int)puVar28;
          local_208[uVar9] = uVar12 + 1;
        }
      }
      else if (uVar9 == 0x3f) {
        uVar9 = fasthuf_read_bits(8,&currBits,&currBitCount,&currByte);
        puVar28 = (uint16_t *)((long)puVar28 + uVar9 + 5);
      }
      else {
        puVar28 = (uint16_t *)((long)puVar28 + (uVar9 - 0x3a));
      }
    }
    lVar13 = 0;
    for (lVar8 = 0x40; lVar8 != 5; lVar8 = lVar8 + -1) {
      lVar22 = *(long *)((long)base + lVar13) << ((byte)lVar8 & 0x3f);
      if (*(long *)((long)base + lVar13) == -1) {
        lVar22 = -1;
      }
      *(long *)((long)spare + lVar13 + 0x40010) = lVar22;
      lVar13 = lVar13 + 8;
    }
    *(undefined8 *)((long)spare + 0x401e8) = 0;
    *(uint64_t *)((long)spare + 0x401f0) = offset[0] - *(long *)((long)spare + 0x40010);
    lVar13 = 0x803f;
    for (lVar8 = 0x3f; lVar8 != 5; lVar8 = lVar8 + -1) {
      *(ulong *)((long)spare + lVar13 * 8) =
           alStack_40998[lVar13] -
           (*(ulong *)((long)spare + lVar13 * 8 + -0x1e0) >> ((byte)lVar8 & 0x3f));
      lVar13 = lVar13 + 1;
    }
    for (uVar12 = 0; uVar12 != 0x4000; uVar12 = uVar12 + 1) {
      *(undefined4 *)((long)spare + uVar12 * 4 + 0x403c8) = 0xffff;
      uVar15 = (uint)local_814 << 0x18;
      for (uVar24 = uVar26; uVar24 <= uVar19; uVar24 = uVar24 + 1) {
        if (*(ulong *)((long)spare + uVar24 * 8 + 0x40010) <= uVar12 << 0x32) {
          uVar24 = ((uVar12 << 0x32) >> (-(char)uVar24 & 0x3fU)) +
                   *(long *)((long)spare + uVar24 * 8 + 0x401f0);
          if ((ulong)(long)*(int *)((long)spare + 4) <= uVar24) {
            if (p_Var23 != (exr_const_context_t)0x0) {
              (**(code **)(p_Var23 + 0x48))(p_Var23,0x17,"Huffman decode error (Overrun)");
            }
            if (uVar12 < 0x4000) {
              return 0x17;
            }
            goto LAB_0010c9a5;
          }
          *(uint *)((long)spare + uVar12 * 4 + 0x403c8) =
               uVar15 | *(uint *)((long)spare + uVar24 * 4 + 0xc);
          break;
        }
        uVar15 = uVar15 + 0x1000000;
      }
    }
LAB_0010c9a5:
    uVar26 = 0xe;
    uVar15 = 0xe;
    do {
      bVar30 = uVar15 == 0;
      uVar15 = uVar15 - 1;
      if (bVar30) {
        uVar19 = *(ulong *)((long)spare + 0x40010);
        break;
      }
      uVar19 = *(ulong *)((long)spare + uVar26 * 8 + 0x40010);
      uVar26 = (ulong)uVar15;
    } while (uVar19 == 0xffffffffffffffff);
    *(ulong *)((long)spare + 0x503c8) = uVar19;
    if (nCompressed < puVar3 + (local_7c0 - (long)local_7b0)) {
      return 1;
    }
    base[0] = (uint64_t)(puVar3 + 0x10);
    local_208[0]._0_4_ = (int)local_7c8 + -0x80;
    uVar26 = *(ulong *)puVar3;
    offset[0] = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
                | uVar26 << 0x38;
    uVar26 = *(ulong *)(puVar3 + 8);
    codeCount[0] = uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                   (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                   (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                   (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
    currByte = (uint8_t *)CONCAT44(currByte._4_4_,0x40);
    uVar15 = 0;
    do {
      iVar18 = 0x40;
      do {
        if ((int)local_7d0 <= (int)uVar15) {
          if ((int)local_208[0] == 0) {
            return 0;
          }
          if (p_Var23 == (exr_const_context_t)0x0) {
            return 0x17;
          }
          (**(code **)(p_Var23 + 0x48))
                    (p_Var23,0x17,
                     "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                    );
          return 0x17;
        }
        if (offset[0] < uVar19) {
          lVar8 = -0x32;
          do {
            lVar13 = lVar8;
            lVar8 = lVar13 + 1;
          } while (offset[0] < *(ulong *)((long)spare + lVar13 * 8 + 0x40218));
          uVar26 = lVar13 + 0x41;
          if ((*(byte *)((long)spare + 9) < uVar26) ||
             (uVar12 = (offset[0] >> (-(char)lVar8 & 0x3fU)) +
                       *(long *)((long)spare + lVar8 * 8 + 0x403f0),
             (ulong)(long)*(int *)((long)spare + 4) <= uVar12)) {
            if (p_Var23 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar20 = "Huffman decode error (Decoded an invalid symbol)";
            goto LAB_0010c4bc;
          }
          uVar7 = *(uint *)((long)spare + uVar12 * 4 + 0xc);
        }
        else {
          uVar7 = *(uint *)((long)spare + (offset[0] >> 0x32) * 4 + 0x403c8);
          uVar26 = (ulong)(uint)((int)uVar7 >> 0x18);
          uVar7 = uVar7 & 0xffffff;
        }
        offset[0] = offset[0] << ((byte)uVar26 & 0x3f);
        iVar18 = iVar18 - (int)uVar26;
        if (uVar7 == *spare) {
          if (iVar18 < 8) {
            FastHufDecoder_refill
                      (offset,0x40 - iVar18,codeCount,(int *)&currByte,(uint8_t **)base,
                       (int *)local_208);
            iVar18 = 0x40;
          }
          if ((int)uVar15 < 1) {
            if (p_Var23 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar20 = "Huffman decode error (RLE code with no previous symbol)";
            goto LAB_0010c4bc;
          }
          uVar7 = (byte)(offset[0] >> 0x38) + uVar15;
          if ((int)local_7d0 < (int)uVar7) {
            if (p_Var23 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar20 = "Huffman decode error (Symbol run beyond expected output buffer length)";
            goto LAB_0010c4bc;
          }
          if (offset[0] >> 0x38 == 0) {
            if (p_Var23 == (exr_const_context_t)0x0) {
              return 0x17;
            }
            pcVar20 = "Huffman decode error (Invalid RLE length)";
            goto LAB_0010c4bc;
          }
          for (uVar26 = 0; offset[0] >> 0x38 != uVar26; uVar26 = uVar26 + 1) {
            local_7f0[uVar15 + uVar26] = local_7f0[(ulong)uVar15 - 1];
          }
          offset[0] = offset[0] << 8;
          iVar18 = iVar18 + -8;
          uVar15 = uVar7;
        }
        else {
          local_7f0[(int)uVar15] = (uint16_t)uVar7;
          uVar15 = uVar15 + 1;
        }
      } while (0x3f < iVar18);
      FastHufDecoder_refill
                (offset,0x40 - iVar18,codeCount,(int *)&currByte,(uint8_t **)base,(int *)local_208);
    } while( true );
  }
  local_7e0 = (long)spare + 0x80008;
  pbVar29 = (byte *)(nCompressed - 0x14);
  memset(spare,0,0xc0008);
  offset[0] = 0;
  codeCount[0] = codeCount[0] & 0xffffffff00000000;
  base[0] = (uint64_t)pbVar27;
  for (; uVar9 = base[0], uVar15 <= uVar7; uVar15 = uVar15 + 1) {
    if (((uint)codeCount[0] < 6) && (pbVar29 <= (byte *)(base[0] - (long)pbVar27)))
    goto LAB_0010c329;
    uVar9 = getBits(6,offset,(uint32_t *)codeCount,(uint8_t **)base);
    uVar26 = (ulong)uVar15;
    *(uint64_t *)((long)spare + uVar26 * 8) = uVar9;
    if (uVar9 == 0x3f) {
      if ((((uint)codeCount[0] < 8) && (pbVar29 <= (byte *)(base[0] - (long)pbVar27))) ||
         (uVar9 = getBits(8,offset,(uint32_t *)codeCount,(uint8_t **)base),
         (long)puVar25 + 1U < uVar9 + uVar26 + 6)) goto LAB_0010c329;
      lVar8 = uVar9 + 6;
      while (bVar30 = lVar8 != 0, lVar8 = lVar8 + -1, bVar30) {
        uVar26 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
        *(undefined8 *)((long)spare + uVar26 * 8) = 0;
      }
LAB_0010c1dc:
      uVar15 = uVar15 - 1;
    }
    else if (0x3a < uVar9) {
      if ((uVar9 + uVar26) - 0x39 <= (long)puVar25 + 1U) {
        lVar8 = uVar9 - 0x39;
        while (bVar30 = lVar8 != 0, lVar8 = lVar8 + -1, bVar30) {
          uVar26 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          *(undefined8 *)((long)spare + uVar26 * 8) = 0;
        }
        goto LAB_0010c1dc;
      }
      goto LAB_0010c329;
    }
  }
  pbVar29 = pbVar27 + ((long)pbVar29 - base[0]);
  hufCanonicalCodeTable((uint64_t *)spare);
  pbVar27 = (byte *)uVar9;
LAB_0010c329:
  uVar26 = local_7e0;
  if ((ulong)((long)pbVar29 << 3) < local_7c8) {
    return 0x17;
  }
  uVar15 = 0x17;
  for (puVar28 = local_7b8; puVar28 <= local_7f8; puVar28 = (uint16_t *)((long)puVar28 + 1)) {
    uVar19 = *(ulong *)((long)spare + (long)puVar28 * 8);
    uVar12 = uVar19 >> 6;
    if (uVar12 >> ((byte)uVar19 & 0x3f) != 0) goto LAB_0010cd01;
    uVar5 = (uint)uVar19 & 0x3f;
    if (uVar5 < 0xf) {
      if ((uVar19 & 0x3f) != 0) {
        bVar14 = 0xe - (char)uVar5;
        lVar13 = (uVar12 << (bVar14 & 0x3f)) * 0x10 + uVar26;
        for (lVar8 = 0; (ulong)(uint)(1 << (bVar14 & 0x1f)) << 4 != lVar8; lVar8 = lVar8 + 0x10) {
          if ((*(int *)(lVar13 + lVar8) != 0) || (*(long *)(lVar13 + 8 + lVar8) != 0))
          goto LAB_0010cd01;
          *(uint *)(lVar13 + lVar8) = uVar5;
          *(int *)(lVar13 + 4 + lVar8) = (int)puVar28;
        }
      }
    }
    else {
      lVar8 = (uVar12 >> ((char)uVar5 - 0xeU & 0x3f)) * 0x10;
      if (*(int *)(uVar26 + lVar8) != 0) goto LAB_0010cd01;
      lVar8 = lVar8 + uVar26;
      uVar5 = *(int *)(lVar8 + 4) + 1;
      *(uint *)(lVar8 + 4) = uVar5;
      pvVar11 = *(void **)(lVar8 + 8);
      if (pvVar11 == (void *)0x0) {
        pvVar11 = internal_exr_alloc(4);
        *(void **)(lVar8 + 8) = pvVar11;
      }
      else {
        pvVar10 = internal_exr_alloc((ulong)uVar5 << 2);
        *(void **)(lVar8 + 8) = pvVar10;
        if (pvVar10 != (void *)0x0) {
          iVar18 = *(int *)(lVar8 + 4);
          for (uVar19 = 0; iVar18 - 1 != uVar19; uVar19 = uVar19 + 1) {
            *(undefined4 *)((long)pvVar10 + uVar19 * 4) =
                 *(undefined4 *)((long)pvVar11 + uVar19 * 4);
          }
        }
        internal_exr_free(pvVar11);
        pvVar11 = *(void **)(lVar8 + 8);
      }
      if (pvVar11 == (void *)0x0) goto LAB_0010ccfa;
      *(int *)((long)pvVar11 + (ulong)(*(int *)(lVar8 + 4) - 1) * 4) = (int)puVar28;
    }
  }
  puVar28 = local_7f0 + local_7d0;
  pbVar29 = pbVar27 + local_7c0;
  iVar18 = 0;
  uVar19 = 0;
  puVar25 = local_7f0;
  while (pbVar27 < pbVar29) {
    bVar14 = *pbVar27;
    pbVar27 = pbVar27 + 1;
    uVar19 = uVar19 << 8 | (ulong)bVar14;
    iVar18 = iVar18 + 8;
    while (0xd < iVar18) {
      uVar12 = (ulong)(((uint)(uVar19 >> ((char)iVar18 - 0xeU & 0x3f)) & 0x3fff) << 4);
      lVar8 = uVar26 + uVar12;
      iVar16 = *(int *)(uVar26 + uVar12);
      if (iVar16 == 0) {
        local_7f8 = puVar28;
        if (*(long *)(lVar8 + 8) == 0) goto LAB_0010cd01;
        uVar5 = *(uint *)(lVar8 + 4);
        uVar12 = 0;
        while( true ) {
          if (uVar12 == uVar5) goto LAB_0010cd01;
          uVar2 = *(uint *)(*(long *)(lVar8 + 8) + uVar12 * 4);
          uVar26 = *(ulong *)((long)spare + (ulong)uVar2 * 8);
          uVar17 = (uint)uVar26;
          uVar21 = uVar17 & 0x3f;
          for (; (iVar18 < (int)uVar21 && (pbVar27 < pbVar29)); pbVar27 = pbVar27 + 1) {
            uVar19 = uVar19 << 8 | (ulong)*pbVar27;
            iVar18 = iVar18 + 8;
          }
          if (((int)uVar21 <= iVar18) &&
             (uVar26 >> 6 ==
              (~(-1L << ((byte)uVar26 & 0x3f)) & uVar19 >> ((char)iVar18 - (char)uVar21 & 0x3fU))))
          break;
          uVar12 = uVar12 + 1;
        }
        iVar16 = iVar18 - (uVar17 & 0x3f);
        if (uVar2 == uVar7) {
          if (iVar16 < 8) {
            if (pbVar29 <= pbVar27) goto LAB_0010ccfa;
            bVar14 = *pbVar27;
            pbVar27 = pbVar27 + 1;
            uVar19 = uVar19 << 8 | (ulong)bVar14;
            iVar16 = (iVar18 - (uVar17 & 0x3f)) + 8;
          }
          iVar18 = iVar16 + -8;
          uVar26 = uVar19 >> ((byte)iVar18 & 0x3f);
          if (puVar28 < puVar25 + (uVar26 & 0xff)) goto LAB_0010cd01;
          if (puVar25 + -1 < local_7f0) goto LAB_0010ccfa;
          uVar1 = puVar25[-1];
          while (cVar4 = (char)uVar26, uVar26 = (ulong)(byte)(cVar4 - 1), cVar4 != '\0') {
            *puVar25 = uVar1;
            puVar25 = puVar25 + 1;
          }
        }
        else {
          if (puVar28 <= puVar25) goto LAB_0010cd01;
          *puVar25 = (uint16_t)uVar2;
          puVar25 = puVar25 + 1;
          iVar18 = iVar16;
        }
        uVar26 = local_7e0;
        if (uVar5 == (uint)uVar12) goto LAB_0010cd01;
      }
      else {
        iVar6 = iVar18 - iVar16;
        if (iVar18 < iVar16) goto LAB_0010cd01;
        if (*(uint *)(lVar8 + 4) == uVar7) {
          if (iVar6 < 8) {
            if (pbVar29 <= pbVar27) goto LAB_0010ccfa;
            bVar14 = *pbVar27;
            pbVar27 = pbVar27 + 1;
            uVar19 = uVar19 << 8 | (ulong)bVar14;
            iVar6 = iVar6 + 8;
          }
          iVar18 = iVar6 + -8;
          uVar12 = uVar19 >> ((byte)iVar18 & 0x3f);
          if (puVar28 < puVar25 + (uVar12 & 0xff)) goto LAB_0010cd01;
          if (puVar25 + -1 < local_7f0) goto LAB_0010ccfa;
          uVar1 = puVar25[-1];
          while (cVar4 = (char)uVar12, uVar12 = (ulong)(byte)(cVar4 - 1), cVar4 != '\0') {
            *puVar25 = uVar1;
            puVar25 = puVar25 + 1;
          }
        }
        else {
          if (puVar28 <= puVar25) goto LAB_0010cd01;
          *puVar25 = (uint16_t)*(uint *)(lVar8 + 4);
          puVar25 = puVar25 + 1;
          iVar18 = iVar6;
        }
      }
    }
  }
  uVar5 = -(int)local_7c8 & 7;
  uVar19 = uVar19 >> (sbyte)uVar5;
  iVar18 = iVar18 - uVar5;
  while (0 < iVar18) {
    uVar12 = (ulong)(((uint)(uVar19 << (0xeU - (char)iVar18 & 0x3f)) & 0x3fff) << 4);
    iVar16 = *(int *)(uVar26 + uVar12);
    if ((iVar16 == 0) || (iVar6 = iVar18 - iVar16, iVar18 < iVar16)) goto LAB_0010cd01;
    uVar5 = *(uint *)(uVar12 + uVar26 + 4);
    if (uVar5 == uVar7) {
      if (iVar6 < 8) {
        if (pbVar29 <= pbVar27) goto LAB_0010ccfa;
        bVar14 = *pbVar27;
        pbVar27 = pbVar27 + 1;
        uVar19 = uVar19 << 8 | (ulong)bVar14;
        iVar6 = iVar6 + 8;
      }
      iVar18 = iVar6 + -8;
      uVar12 = uVar19 >> ((byte)iVar18 & 0x3f);
      if (puVar28 < puVar25 + (uVar12 & 0xff)) goto LAB_0010cd01;
      if (puVar25 + -1 < local_7f0) goto LAB_0010ccfa;
      uVar1 = puVar25[-1];
      while (cVar4 = (char)uVar12, uVar12 = (ulong)(byte)(cVar4 - 1), uVar26 = local_7e0,
            cVar4 != '\0') {
        *puVar25 = uVar1;
        puVar25 = puVar25 + 1;
      }
    }
    else {
      if (puVar28 <= puVar25) goto LAB_0010cd01;
      *puVar25 = (uint16_t)uVar5;
      puVar25 = puVar25 + 1;
      iVar18 = iVar6;
    }
  }
  uVar15 = (uint)(puVar25 != puVar28);
LAB_0010cd01:
  for (lVar8 = 0; lVar8 != 0x40000; lVar8 = lVar8 + 0x10) {
    pvVar11 = *(void **)((long)spare + lVar8 + 0x80010);
    if (pvVar11 != (void *)0x0) {
      internal_exr_free(pvVar11);
      *(undefined8 *)((long)spare + lVar8 + 0x80010) = 0;
    }
  }
  return uVar15;
LAB_0010ccfa:
  uVar15 = 1;
  goto LAB_0010cd01;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t                            im, iM, nBits;
    uint64_t                            nBytes;
    const uint8_t*                      ptr;
    exr_result_t                        rv;
    const struct _internal_exr_context* pctxt = NULL;
    const uint64_t hufInfoBlockSize           = 5 * sizeof (uint32_t);

    if (decode) pctxt = EXR_CCTXT (decode->context);
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (pctxt, fhd, &ptr, (int) (nCompressed - hufInfoBlockSize), im, iM, iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ( (uint64_t)(ptr - compressed) + nBytes > nCompressed )
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, (int) nRaw);
        }
    }
    else
    {
        uint64_t* freq     = (uint64_t*) spare;
        HufDec*   hdec     = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft    = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (hdec);
    }
    return rv;
}